

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CURLcode add_chunk(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen)

{
  void *pvVar1;
  CURLcode CVar2;
  ulong local_470;
  size_t local_468;
  size_t n;
  int hdlen;
  char hd [11];
  _Bool eos;
  size_t nread;
  char tmp [1024];
  CURLcode local_3c;
  CURLcode result;
  chunked_reader *ctx;
  size_t blen_local;
  char *buf_local;
  Curl_creader *reader_local;
  Curl_easy *data_local;
  
  pvVar1 = reader->ctx;
  local_470 = blen;
  if (0xffff < blen) {
    local_470 = 0x10000;
  }
  if (local_470 < 0x400) {
    blen_local = (size_t)&nread;
    ctx = (chunked_reader *)0x400;
  }
  else {
    ctx = (chunked_reader *)(local_470 - 0xc);
    blen_local = (size_t)buf;
  }
  CVar2 = Curl_creader_read(data,reader->next,(char *)blen_local,(size_t)ctx,(size_t *)(hd + 4),
                            (_Bool *)(hd + 3));
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  if ((hd[3] & 1U) != 0) {
    *(byte *)((long)pvVar1 + 0x60) = *(byte *)((long)pvVar1 + 0x60) & 0xfe | 1;
  }
  if (stack0xfffffffffffffbb0 != 0) {
    memset((void *)((long)&n + 4),0,0xb);
    n._0_4_ = curl_msnprintf((char *)((long)&n + 4),0xb,"%zx\r\n",stack0xfffffffffffffbb0);
    if ((int)n < 1) {
      return CURLE_READ_ERROR;
    }
    local_3c = Curl_bufq_cwrite((bufq *)((long)pvVar1 + 0x20),(char *)((long)&n + 4),(long)(int)n,
                                &local_468);
    if (local_3c == CURLE_OK) {
      local_3c = Curl_bufq_cwrite((bufq *)((long)pvVar1 + 0x20),(char *)blen_local,
                                  stack0xfffffffffffffbb0,&local_468);
    }
    if (local_3c == CURLE_OK) {
      local_3c = Curl_bufq_cwrite((bufq *)((long)pvVar1 + 0x20),"\r\n",2,&local_468);
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_read.log_level)) {
      Curl_trc_read(data,"http_chunk, made chunk of %zu bytes -> %d",stack0xfffffffffffffbb0,
                    (ulong)local_3c);
    }
    if (local_3c != CURLE_OK) {
      return local_3c;
    }
  }
  if ((*(byte *)((long)pvVar1 + 0x60) & 1) == 0) {
    data_local._4_4_ = CURLE_OK;
  }
  else {
    data_local._4_4_ = add_last_chunk(data,reader);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode add_chunk(struct Curl_easy *data,
                          struct Curl_creader *reader,
                          char *buf, size_t blen)
{
  struct chunked_reader *ctx = reader->ctx;
  CURLcode result;
  char tmp[CURL_CHUNKED_MINLEN];
  size_t nread;
  bool eos;

  DEBUGASSERT(!ctx->read_eos);
  blen = CURLMIN(blen, CURL_CHUNKED_MAXLEN); /* respect our buffer pref */
  if(blen < sizeof(tmp)) {
    /* small read, make a chunk of decent size */
    buf = tmp;
    blen = sizeof(tmp);
  }
  else {
    /* larger read, make a chunk that will fit when read back */
    blen -= (8 + 2 + 2); /* deduct max overhead, 8 hex + 2*crlf */
  }

  result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
  if(result)
    return result;
  if(eos)
    ctx->read_eos = TRUE;

  if(nread) {
    /* actually got bytes, wrap them into the chunkbuf */
    char hd[11] = "";
    int hdlen;
    size_t n;

    hdlen = msnprintf(hd, sizeof(hd), "%zx\r\n", nread);
    if(hdlen <= 0)
      return CURLE_READ_ERROR;
    /* On a soft-limited bufq, we do not need to check that all was written */
    result = Curl_bufq_cwrite(&ctx->chunkbuf, hd, hdlen, &n);
    if(!result)
      result = Curl_bufq_cwrite(&ctx->chunkbuf, buf, nread, &n);
    if(!result)
      result = Curl_bufq_cwrite(&ctx->chunkbuf, "\r\n", 2, &n);
    CURL_TRC_READ(data, "http_chunk, made chunk of %zu bytes -> %d",
                 nread, result);
    if(result)
      return result;
  }

  if(ctx->read_eos)
    return add_last_chunk(data, reader);
  return CURLE_OK;
}